

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_8bytes.cpp
# Opt level: O3

Sketch * ConstructGeneric8Bytes(int bits,int implementation)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (Sketch *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

Sketch* ConstructGeneric8Bytes(int bits, int implementation)
{
    switch (bits) {
#ifdef ENABLE_FIELD_INT_57
    case 57: return new SketchImpl<Field57>(implementation, 57);
#endif
#ifdef ENABLE_FIELD_INT_58
    case 58: return new SketchImpl<Field58>(implementation, 58);
#endif
#ifdef ENABLE_FIELD_INT_59
    case 59: return new SketchImpl<Field59>(implementation, 59);
#endif
#ifdef ENABLE_FIELD_INT_60
    case 60: return new SketchImpl<Field60>(implementation, 60);
#endif
#ifdef ENABLE_FIELD_INT_61
    case 61: return new SketchImpl<Field61>(implementation, 61);
#endif
#ifdef ENABLE_FIELD_INT_62
    case 62: return new SketchImpl<Field62>(implementation, 62);
#endif
#ifdef ENABLE_FIELD_INT_63
    case 63: return new SketchImpl<Field63>(implementation, 63);
#endif
#ifdef ENABLE_FIELD_INT_64
    case 64: return new SketchImpl<Field64>(implementation, 64);
#endif
    default: return nullptr;
    }
}